

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

RealisticCamera *
pbrt::RealisticCamera::Create
          (ParameterDictionary *parameters,CameraTransform *cameraTransform,FilmHandle *film,
          MediumHandle *medium,FileLoc *loc,Allocator alloc)

{
  Point2<float> PVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Point2i resolution;
  bool bVar4;
  int i;
  int iVar5;
  Allocator alloc_00;
  int iVar7;
  RealisticCamera *pRVar6;
  Point2i resolution_00;
  Point2i resolution_01;
  int i_1;
  ulong uVar8;
  int x;
  long lVar9;
  long lVar10;
  int x_2;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  float fVar14;
  Float FVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_01;
  span<const_pbrt::Point2<float>_> vert_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_pbrt::Point2<float>_> vert_01;
  allocator<char> local_919;
  undefined1 local_918 [16];
  allocator<char> local_901;
  Allocator alloc_local;
  int builtinRes;
  long local_8f0;
  float local_8e4;
  Float focusDistance;
  Float apertureDiameter;
  string apertureName;
  WrapMode2D local_8b8;
  WrapMode2D local_8b0;
  WrapMode2D local_8a8;
  anon_class_16_2_5a488c63 rasterize;
  vector<float,_std::allocator<float>_> lensParameters;
  string lensFile;
  ImageChannelDesc rgbDesc;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_828;
  array<pbrt::Point2<float>,_10> vert;
  undefined1 local_7a8 [200];
  ColorEncodingHandle local_6e0;
  ColorEncodingHandle local_6d8;
  ColorEncodingHandle local_6d0;
  ColorEncodingHandle local_6c8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_6c0;
  TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm> local_6b8;
  Image apertureImage;
  ImageAndMetadata im;
  CameraBaseParameters cameraBaseParameters;
  
  local_6b8.bits = (film->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits;
  local_6c0.bits =
       (medium->
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
       ).bits;
  alloc_local = alloc;
  CameraBaseParameters::CameraBaseParameters
            (&cameraBaseParameters,cameraTransform,(FilmHandle *)&local_6b8,
             (MediumHandle *)&local_6c0,parameters,loc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&apertureImage,"lensfile",(allocator<char> *)&rgbDesc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vert,"",(allocator<char> *)&local_828);
  ParameterDictionary::GetOneString
            ((string *)&im,parameters,(string *)&apertureImage,(string *)&vert);
  ResolveFilename(&lensFile,(string *)&im);
  std::__cxx11::string::~string((string *)&im);
  std::__cxx11::string::~string((string *)&vert);
  std::__cxx11::string::~string((string *)&apertureImage);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&im,"aperturediameter",(allocator<char> *)&apertureImage);
  local_918._0_4_ = ParameterDictionary::GetOneFloat(parameters,(string *)&im,1.0);
  std::__cxx11::string::~string((string *)&im);
  apertureDiameter = (Float)local_918._0_4_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&im,"focusdistance",(allocator<char> *)&apertureImage);
  local_918._0_4_ = ParameterDictionary::GetOneFloat(parameters,(string *)&im,10.0);
  std::__cxx11::string::~string((string *)&im);
  focusDistance = (Float)local_918._0_4_;
  if (lensFile._M_string_length == 0) {
    Error(loc,"No lens description file supplied!");
    pRVar6 = (RealisticCamera *)0x0;
    goto LAB_003c1158;
  }
  ReadFloatFile(&lensParameters,&lensFile);
  if (lensParameters.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start ==
      lensParameters.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    Error<std::__cxx11::string&>(loc,"Error reading lens specification file \"%s\".",&lensFile);
LAB_003c086f:
    pRVar6 = (RealisticCamera *)0x0;
  }
  else {
    if (((long)lensParameters.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)lensParameters.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start & 0xcU) != 0) {
      im.image.format =
           (PixelFormat)
           ((ulong)((long)lensParameters.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)lensParameters.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2);
      Error<std::__cxx11::string&,int>
                (loc,
                 "%s: excess values in lens specification file; must be multiple-of-four values, read %d."
                 ,&lensFile,(int *)&im);
      goto LAB_003c086f;
    }
    rasterize.builtinRes = &builtinRes;
    rasterize.alloc = &alloc_local;
    builtinRes = 0x100;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&apertureImage,"aperture",(allocator<char> *)&rgbDesc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vert,"",(allocator<char> *)&local_828);
    ParameterDictionary::GetOneString
              ((string *)&im,parameters,(string *)&apertureImage,(string *)&vert);
    ResolveFilename(&apertureName,(string *)&im);
    std::__cxx11::string::~string((string *)&im);
    std::__cxx11::string::~string((string *)&vert);
    std::__cxx11::string::~string((string *)&apertureImage);
    alloc_00.memoryResource = pstd::pmr::new_delete_resource();
    Image::Image(&apertureImage,alloc_00);
    if (apertureName._M_string_length != 0) {
      bVar4 = std::operator==(&apertureName,"gaussian");
      iVar5 = builtinRes;
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vert,"Y",(allocator<char> *)&rgbDesc);
        local_6c8.
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )0;
        resolution_00.super_Tuple2<pbrt::Point2,_int>.y = iVar5;
        resolution_00.super_Tuple2<pbrt::Point2,_int>.x = iVar5;
        channels.n = 1;
        channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vert;
        Image::Image(&im.image,Float,resolution_00,channels,&local_6c8,alloc_local);
        Image::operator=(&apertureImage,&im.image);
        Image::~Image(&im.image);
        std::__cxx11::string::~string((string *)&vert);
        lVar11 = 0;
        uVar8 = CONCAT44(apertureImage.resolution.super_Tuple2<pbrt::Point2,_int>.y,
                         apertureImage.resolution.super_Tuple2<pbrt::Point2,_int>.x);
        for (lVar12 = 0; lVar12 < (long)uVar8 >> 0x20; lVar12 = lVar12 + 1) {
          fVar14 = (float)(int)lVar12 + 0.5;
          local_918 = ZEXT416((uint)(fVar14 + fVar14));
          for (lVar9 = 0; lVar9 < (int)uVar8; lVar9 = lVar9 + 1) {
            fVar14 = (float)(int)lVar9 + 0.5;
            auVar17._8_8_ = 0;
            auVar17._0_8_ = uVar8;
            auVar13 = vcvtdq2ps_avx(auVar17);
            auVar2 = vinsertps_avx(ZEXT416((uint)(fVar14 + fVar14)),ZEXT416((uint)local_918._0_4_),
                                   0x10);
            auVar13 = vdivps_avx(auVar2,auVar13);
            auVar2._8_4_ = 0xbf800000;
            auVar2._0_8_ = 0xbf800000bf800000;
            auVar2._12_4_ = 0xbf800000;
            auVar13 = vaddps_avx512vl(auVar13,auVar2);
            auVar16._0_4_ = auVar13._0_4_ * auVar13._0_4_;
            auVar16._4_4_ = auVar13._4_4_ * auVar13._4_4_;
            auVar16._8_4_ = auVar13._8_4_ * auVar13._8_4_;
            auVar16._12_4_ = auVar13._12_4_ * auVar13._12_4_;
            auVar13 = vhaddps_avx(auVar16,auVar16);
            auVar3._8_4_ = 0x80000000;
            auVar3._0_8_ = 0x8000000080000000;
            auVar3._12_4_ = 0x80000000;
            auVar13 = vxorps_avx512vl(auVar13,auVar3);
            fVar14 = expf(auVar13._0_4_);
            auVar13 = vmaxss_avx(ZEXT416((uint)(fVar14 + -0.36787945)),ZEXT416(0));
            Image::SetChannel(&apertureImage,(Point2i)(lVar11 + lVar9),0,auVar13._0_4_);
            uVar8 = CONCAT44(apertureImage.resolution.super_Tuple2<pbrt::Point2,_int>.y,
                             apertureImage.resolution.super_Tuple2<pbrt::Point2,_int>.x);
          }
          lVar11 = lVar11 + 0x100000000;
        }
      }
      else {
        bVar4 = std::operator==(&apertureName,"square");
        iVar5 = builtinRes;
        if (bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vert,"Y",(allocator<char> *)&rgbDesc);
          local_6d0.
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )0;
          resolution_01.super_Tuple2<pbrt::Point2,_int>.y = iVar5;
          resolution_01.super_Tuple2<pbrt::Point2,_int>.x = iVar5;
          channels_00.n = 1;
          channels_00.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vert;
          Image::Image(&im.image,Float,resolution_01,channels_00,&local_6d0,alloc_local);
          Image::operator=(&apertureImage,&im.image);
          Image::~Image(&im.image);
          std::__cxx11::string::~string((string *)&vert);
          lVar12 = 0;
          lVar11 = CONCAT44(apertureImage.resolution.super_Tuple2<pbrt::Point2,_int>.y,
                            apertureImage.resolution.super_Tuple2<pbrt::Point2,_int>.x);
          for (lVar9 = 0; lVar9 < lVar11 >> 0x20; lVar9 = lVar9 + 1) {
            for (lVar10 = 0; lVar10 < (int)lVar11; lVar10 = lVar10 + 1) {
              Image::SetChannel(&apertureImage,(Point2i)(lVar12 + lVar10),0,1.0);
              lVar11 = CONCAT44(apertureImage.resolution.super_Tuple2<pbrt::Point2,_int>.y,
                                apertureImage.resolution.super_Tuple2<pbrt::Point2,_int>.x);
            }
            lVar12 = lVar12 + 0x100000000;
          }
        }
        else {
          bVar4 = std::operator==(&apertureName,"pentagon");
          if (bVar4) {
            vert.values[0].super_Tuple2<pbrt::Point2,_float>.x = 0.0;
            vert.values[0].super_Tuple2<pbrt::Point2,_float>.y = 1.0;
            vert.values[1].super_Tuple2<pbrt::Point2,_float>.x = 0.9510565;
            vert.values[1].super_Tuple2<pbrt::Point2,_float>.y = 0.309017;
            vert.values[2].super_Tuple2<pbrt::Point2,_float>.x = 0.58778524;
            vert.values[2].super_Tuple2<pbrt::Point2,_float>.y = -0.809017;
            vert.values[3].super_Tuple2<pbrt::Point2,_float>.x = -0.58778524;
            vert.values[3].super_Tuple2<pbrt::Point2,_float>.y = -0.809017;
            vert.values[4].super_Tuple2<pbrt::Point2,_float>.x = -0.9510565;
            vert.values[4].super_Tuple2<pbrt::Point2,_float>.y = 0.309017;
            for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
              auVar13._0_4_ = vert.values[lVar11].super_Tuple2<pbrt::Point2,_float>.x * 0.8;
              auVar13._4_4_ = vert.values[lVar11].super_Tuple2<pbrt::Point2,_float>.y * 0.8;
              auVar13._8_8_ = 0;
              PVar1.super_Tuple2<pbrt::Point2,_float> =
                   (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar13);
              vert.values[lVar11].super_Tuple2<pbrt::Point2,_float> =
                   PVar1.super_Tuple2<pbrt::Point2,_float>;
            }
            vert_00.n = 5;
            vert_00.ptr = vert.values;
            Create::anon_class_16_2_5a488c63::operator()(&im.image,&rasterize,vert_00);
            Image::operator=(&apertureImage,&im.image);
          }
          else {
            bVar4 = std::operator==(&apertureName,"star");
            if (!bVar4) {
              local_6d8.
              super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
              .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                       )0;
              Image::Read(&im,&apertureName,alloc_local,&local_6d8);
              Image::operator=(&apertureImage,&im.image);
              if (1 < (int)apertureImage.channelNames.nStored) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&vert,"R",(allocator<char> *)&local_828);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)(vert.values + 4),"G",&local_919);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)(vert.values + 8),"B",&local_901);
                requestedChannels.n = 3;
                requestedChannels.ptr =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vert;
                Image::GetChannelDesc(&rgbDesc,&apertureImage,requestedChannels);
                lVar11 = 0x40;
                do {
                  std::__cxx11::string::~string
                            ((string *)
                             ((long)&vert.values[0].super_Tuple2<pbrt::Point2,_float>.x + lVar11));
                  lVar11 = lVar11 + -0x20;
                } while (lVar11 != -0x20);
                if (rgbDesc.offset.nStored == 0) {
                  ErrorExit<std::__cxx11::string&>
                            ("%s: didn\'t find R, G, B channels to average for aperture image.",
                             &apertureName);
                }
                resolution.super_Tuple2<pbrt::Point2,_int>.y =
                     apertureImage.resolution.super_Tuple2<pbrt::Point2,_int>.y;
                resolution.super_Tuple2<pbrt::Point2,_int>.x =
                     apertureImage.resolution.super_Tuple2<pbrt::Point2,_int>.x;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_828,"Y",&local_919);
                local_6e0.
                super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                         )0;
                channels_01.n = 1;
                channels_01.ptr =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_828
                ;
                Image::Image((Image *)&vert,Float,resolution,channels_01,&local_6e0,alloc_local);
                std::__cxx11::string::~string((string *)&local_828);
                lVar12 = 0;
                lVar11 = CONCAT44(vert.values[1].super_Tuple2<pbrt::Point2,_float>.x,
                                  vert.values[0].super_Tuple2<pbrt::Point2,_float>.y);
                for (local_8f0 = 0; local_8f0 < lVar11 >> 0x20; local_8f0 = local_8f0 + 1) {
                  for (lVar9 = 0; lVar9 < (int)lVar11; lVar9 = lVar9 + 1) {
                    WrapMode2D::WrapMode2D(&local_8a8,Clamp);
                    Image::GetChannels((ImageChannelValues *)&local_828,&apertureImage,
                                       (Point2i)(lVar12 + lVar9),&rgbDesc,local_8a8);
                    FVar15 = ImageChannelValues::Average((ImageChannelValues *)&local_828);
                    local_918._0_4_ = FVar15;
                    InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                    ~InlinedVector(&local_828);
                    Image::SetChannel((Image *)&vert,(Point2i)(lVar12 + lVar9),0,
                                      (Float)local_918._0_4_);
                    lVar11 = CONCAT44(vert.values[1].super_Tuple2<pbrt::Point2,_float>.x,
                                      vert.values[0].super_Tuple2<pbrt::Point2,_float>.y);
                  }
                  lVar12 = lVar12 + 0x100000000;
                }
                Image::operator=(&apertureImage,(Image *)&vert);
                Image::~Image((Image *)&vert);
                InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                          (&rgbDesc.offset);
              }
              ImageAndMetadata::~ImageAndMetadata(&im);
              goto LAB_003c0fb7;
            }
            vert.values[8].super_Tuple2<pbrt::Point2,_float>.x = 0.0;
            vert.values[8].super_Tuple2<pbrt::Point2,_float>.y = 0.0;
            vert.values[9].super_Tuple2<pbrt::Point2,_float>.x = 0.0;
            vert.values[9].super_Tuple2<pbrt::Point2,_float>.y = 0.0;
            vert.values[0].super_Tuple2<pbrt::Point2,_float>.x = 0.0;
            vert.values[0].super_Tuple2<pbrt::Point2,_float>.y = 0.0;
            vert.values[1].super_Tuple2<pbrt::Point2,_float>.x = 0.0;
            vert.values[1].super_Tuple2<pbrt::Point2,_float>.y = 0.0;
            vert.values[2].super_Tuple2<pbrt::Point2,_float>.x = 0.0;
            vert.values[2].super_Tuple2<pbrt::Point2,_float>.y = 0.0;
            vert.values[3].super_Tuple2<pbrt::Point2,_float>.x = 0.0;
            vert.values[3].super_Tuple2<pbrt::Point2,_float>.y = 0.0;
            vert.values[4].super_Tuple2<pbrt::Point2,_float>.x = 0.0;
            vert.values[4].super_Tuple2<pbrt::Point2,_float>.y = 0.0;
            vert.values[5].super_Tuple2<pbrt::Point2,_float>.x = 0.0;
            vert.values[5].super_Tuple2<pbrt::Point2,_float>.y = 0.0;
            vert.values[6].super_Tuple2<pbrt::Point2,_float>.x = 0.0;
            vert.values[6].super_Tuple2<pbrt::Point2,_float>.y = 0.0;
            vert.values[7].super_Tuple2<pbrt::Point2,_float>.x = 0.0;
            vert.values[7].super_Tuple2<pbrt::Point2,_float>.y = 0.0;
            for (uVar8 = 0; uVar8 != 10; uVar8 = uVar8 + 1) {
              local_918._0_4_ = *(undefined4 *)(&DAT_02cf1ea8 + (ulong)((uVar8 & 1) == 0) * 4);
              local_8e4 = ((float)(int)uVar8 * 3.1415927) / 5.0;
              fVar14 = cosf(local_8e4);
              local_8f0 = CONCAT44(local_8f0._4_4_,fVar14 * (float)local_918._0_4_);
              fVar14 = sinf(local_8e4);
              vert.values[uVar8].super_Tuple2<pbrt::Point2,_float>.x = (float)local_8f0;
              vert.values[uVar8].super_Tuple2<pbrt::Point2,_float>.y =
                   fVar14 * (float)local_918._0_4_;
            }
            std::__reverse<pbrt::Point2<float>*>(&vert,local_7a8);
            vert_01.n = 10;
            vert_01.ptr = vert.values;
            Create::anon_class_16_2_5a488c63::operator()(&im.image,&rasterize,vert_01);
            Image::operator=(&apertureImage,&im.image);
          }
          Image::~Image(&im.image);
        }
      }
LAB_003c0fb7:
      if ((0 < apertureImage.resolution.super_Tuple2<pbrt::Point2,_int>.x) &&
         (0 < apertureImage.resolution.super_Tuple2<pbrt::Point2,_int>.y)) {
        lVar12 = 0;
        local_918._0_4_ = 0.0;
        iVar5 = apertureImage.resolution.super_Tuple2<pbrt::Point2,_int>.x;
        iVar7 = apertureImage.resolution.super_Tuple2<pbrt::Point2,_int>.y;
        for (lVar11 = 0; lVar11 < iVar7; lVar11 = lVar11 + 1) {
          for (lVar9 = 0; lVar9 < iVar5; lVar9 = lVar9 + 1) {
            WrapMode2D::WrapMode2D(&local_8b0,Clamp);
            FVar15 = Image::GetChannel(&apertureImage,(Point2i)(lVar12 + lVar9),0,local_8b0);
            local_918._0_4_ = (float)local_918._0_4_ + FVar15;
            iVar5 = apertureImage.resolution.super_Tuple2<pbrt::Point2,_int>.x;
            iVar7 = apertureImage.resolution.super_Tuple2<pbrt::Point2,_int>.y;
          }
          lVar12 = lVar12 + 0x100000000;
        }
        lVar12 = 0;
        local_918._0_4_ = 0.7853982 / ((float)local_918._0_4_ / (float)(iVar5 * iVar7));
        for (lVar11 = 0; lVar11 < iVar7; lVar11 = lVar11 + 1) {
          for (lVar9 = 0; lVar9 < iVar5; lVar9 = lVar9 + 1) {
            WrapMode2D::WrapMode2D(&local_8b8,Clamp);
            FVar15 = Image::GetChannel(&apertureImage,(Point2i)(lVar12 + lVar9),0,local_8b8);
            Image::SetChannel(&apertureImage,(Point2i)(lVar12 + lVar9),0,
                              FVar15 * (float)local_918._0_4_);
            iVar5 = apertureImage.resolution.super_Tuple2<pbrt::Point2,_int>.x;
            iVar7 = apertureImage.resolution.super_Tuple2<pbrt::Point2,_int>.y;
          }
          lVar12 = lVar12 + 0x100000000;
        }
      }
    }
    pRVar6 = pstd::pmr::polymorphic_allocator<std::byte>::
             new_object<pbrt::RealisticCamera,pbrt::CameraBaseParameters&,std::vector<float,std::allocator<float>>&,float&,float&,pbrt::Image,pstd::pmr::polymorphic_allocator<std::byte>&>
                       (&alloc_local,&cameraBaseParameters,&lensParameters,&focusDistance,
                        &apertureDiameter,&apertureImage,&alloc_local);
    Image::~Image(&apertureImage);
    std::__cxx11::string::~string((string *)&apertureName);
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&lensParameters.super__Vector_base<float,_std::allocator<float>_>);
LAB_003c1158:
  std::__cxx11::string::~string((string *)&lensFile);
  return pRVar6;
}

Assistant:

RealisticCamera *RealisticCamera::Create(const ParameterDictionary &parameters,
                                         const CameraTransform &cameraTransform,
                                         FilmHandle film, MediumHandle medium,
                                         const FileLoc *loc, Allocator alloc) {
    CameraBaseParameters cameraBaseParameters(cameraTransform, film, medium, parameters,
                                              loc);

    // Realistic camera-specific parameters
    std::string lensFile = ResolveFilename(parameters.GetOneString("lensfile", ""));
    Float apertureDiameter = parameters.GetOneFloat("aperturediameter", 1.0);
    Float focusDistance = parameters.GetOneFloat("focusdistance", 10.0);

    if (lensFile.empty()) {
        Error(loc, "No lens description file supplied!");
        return nullptr;
    }
    // Load element data from lens description file
    std::vector<Float> lensParameters = ReadFloatFile(lensFile);
    if (lensParameters.empty()) {
        Error(loc, "Error reading lens specification file \"%s\".", lensFile);
        return nullptr;
    }
    if (lensParameters.size() % 4 != 0) {
        Error(loc,
              "%s: excess values in lens specification file; "
              "must be multiple-of-four values, read %d.",
              lensFile, (int)lensParameters.size());
        return nullptr;
    }

    int builtinRes = 256;
    auto rasterize = [&](pstd::span<const Point2f> vert) {
        Image image(PixelFormat::Float, {builtinRes, builtinRes}, {"Y"}, nullptr, alloc);

        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x) {
                Point2f p(-1 + 2 * (x + 0.5f) / image.Resolution().x,
                          -1 + 2 * (y + 0.5f) / image.Resolution().y);
                int windingNumber = 0;
                // Test against edges
                for (int i = 0; i < vert.size(); ++i) {
                    int i1 = (i + 1) % vert.size();
                    Float e = (p[0] - vert[i][0]) * (vert[i1][1] - vert[i][1]) -
                              (p[1] - vert[i][1]) * (vert[i1][0] - vert[i][0]);
                    if (vert[i].y <= p.y) {
                        if (vert[i1].y > p.y && e > 0)
                            ++windingNumber;
                    } else if (vert[i1].y <= p.y && e < 0)
                        --windingNumber;
                }

                image.SetChannel({x, y}, 0, windingNumber == 0 ? 0.f : 1.f);
            }

        return image;
    };

    std::string apertureName = ResolveFilename(parameters.GetOneString("aperture", ""));
    Image apertureImage;
    if (!apertureName.empty()) {
        // built-in diaphragm shapes
        if (apertureName == "gaussian") {
            apertureImage = Image(PixelFormat::Float, {builtinRes, builtinRes}, {"Y"},
                                  nullptr, alloc);
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x) {
                    Point2f uv(-1 + 2 * (x + 0.5f) / apertureImage.Resolution().x,
                               -1 + 2 * (y + 0.5f) / apertureImage.Resolution().y);
                    Float r2 = Sqr(uv.x) + Sqr(uv.y);
                    Float sigma2 = 1;
                    Float v = std::max<Float>(
                        0, std::exp(-r2 / sigma2) - std::exp(-1 / sigma2));
                    apertureImage.SetChannel({x, y}, 0, v);
                }
        } else if (apertureName == "square") {
            apertureImage = Image(PixelFormat::Float, {builtinRes, builtinRes}, {"Y"},
                                  nullptr, alloc);
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x)
                    apertureImage.SetChannel({x, y}, 0, 1.f);
        } else if (apertureName == "pentagon") {
            // https://mathworld.wolfram.com/RegularPentagon.html
            Float c1 = (std::sqrt(5.f) - 1) / 4;
            Float c2 = (std::sqrt(5.f) + 1) / 4;
            Float s1 = std::sqrt(10.f + 2.f * std::sqrt(5.f)) / 4;
            Float s2 = std::sqrt(10.f - 2.f * std::sqrt(5.f)) / 4;
            // Vertices in CW order.
            Point2f vert[5] = {Point2f(0, 1), {s1, c1}, {s2, -c2}, {-s2, -c2}, {-s1, c1}};
            // Scale down slightly
            for (int i = 0; i < 5; ++i)
                vert[i] *= .8f;
            apertureImage = rasterize(vert);
        } else if (apertureName == "star") {
            // 5-sided. Vertices are two pentagons--inner and outer radius
            pstd::array<Point2f, 10> vert;
            for (int i = 0; i < 10; ++i) {
                // inner radius: https://math.stackexchange.com/a/2136996
                Float r =
                    (i & 1) ? 1.f : (std::cos(Radians(72.f)) / std::cos(Radians(36.f)));
                vert[i] = Point2f(r * std::cos(Pi * i / 5.f), r * std::sin(Pi * i / 5.f));
            }
            std::reverse(vert.begin(), vert.end());
            apertureImage = rasterize(vert);
        } else {
            ImageAndMetadata im = Image::Read(apertureName, alloc);
            apertureImage = std::move(im.image);
            if (apertureImage.NChannels() > 1) {
                ImageChannelDesc rgbDesc = apertureImage.GetChannelDesc({"R", "G", "B"});
                if (!rgbDesc)
                    ErrorExit("%s: didn't find R, G, B channels to average for "
                              "aperture image.",
                              apertureName);

                Image mono(PixelFormat::Float, apertureImage.Resolution(), {"Y"}, nullptr,
                           alloc);
                for (int y = 0; y < mono.Resolution().y; ++y)
                    for (int x = 0; x < mono.Resolution().x; ++x) {
                        Float avg = apertureImage.GetChannels({x, y}, rgbDesc).Average();
                        mono.SetChannel({x, y}, 0, avg);
                    }

                apertureImage = std::move(mono);
            }
        }

        if (apertureImage) {
            // Normalize it so that brightness matches a circular aperture
            Float sum = 0;
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x)
                    sum += apertureImage.GetChannel({x, y}, 0);
            Float avg =
                sum / (apertureImage.Resolution().x * apertureImage.Resolution().y);

            Float scale = (Pi / 4) / avg;
            for (int y = 0; y < apertureImage.Resolution().y; ++y)
                for (int x = 0; x < apertureImage.Resolution().x; ++x)
                    apertureImage.SetChannel({x, y}, 0,
                                             apertureImage.GetChannel({x, y}, 0) * scale);
        }
    }

    return alloc.new_object<RealisticCamera>(cameraBaseParameters, lensParameters,
                                             focusDistance, apertureDiameter,
                                             std::move(apertureImage), alloc);
}